

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_ManCubeDoubleCubeDivisors
               (Fx_Man_t *p,int iFirst,Vec_Int_t *vPivot,int fRemove,int fUpdate,int *fWarning)

{
  int iVar1;
  int iVar2;
  int i;
  int iVar3;
  Vec_Int_t *pVVar4;
  undefined4 in_register_0000000c;
  int *fWarning_00;
  Vec_Flt_t *p_00;
  
  fWarning_00 = (int *)CONCAT44(in_register_0000000c,fRemove);
  do {
    if (p->vCubes->nSize <= iFirst) {
      return;
    }
    pVVar4 = Vec_WecEntry(p->vCubes,iFirst);
    if (((pVVar4 != vPivot) && (pVVar4->nSize != 0)) &&
       (((pVVar4->nCap & 0x40000000) == 0 ||
        ((pVVar4 <= vPivot || (fWarning_00 = (int *)0x40000000, (vPivot->nCap & 0x40000000U) == 0)))
        ))) {
      iVar1 = Vec_IntEntry(pVVar4,0);
      iVar2 = Vec_IntEntry(vPivot,0);
      if (iVar1 != iVar2) {
        return;
      }
      iVar1 = Fx_ManDivFindCubeFree(pVVar4,vPivot,p->vCubeFree,fWarning_00);
      pVVar4 = p->vCubeFree;
      if (pVVar4->nSize == 4) {
        iVar2 = Fx_ManDivNormalize(pVVar4);
        fWarning_00 = p->nDivMux;
        if ((iVar2 != 0) && (fWarning_00 = p->nDivMux + 1, iVar2 != 1)) {
          fWarning_00 = p->nDivMux + 2;
        }
        *fWarning_00 = *fWarning_00 + 1;
        if ((iVar2 < 0) && (p->fCanonDivs != 0)) goto LAB_00248e53;
        pVVar4 = p->vCubeFree;
      }
      if (((p->LitCountMax == 0) || (pVVar4->nSize <= p->LitCountMax)) &&
         ((p->fCanonDivs == 0 || (pVVar4->nSize != 3)))) {
        i = Hsh_VecManAdd(p->pHash,pVVar4);
        p_00 = p->vWeights;
        iVar2 = p_00->nSize;
        if (fRemove == 0) {
          if (i == iVar2) {
            iVar2 = p->vCubeFree->nSize;
            iVar3 = Fx_ManComputeLevelDiv(p,p->vCubeFree);
            Vec_FltPush(p_00,(float)iVar3 * -0.0009 + (float)-iVar2 + 0.9);
            p_00 = p->vWeights;
            iVar2 = p_00->nSize;
          }
          if (iVar2 <= i) {
            __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                          ,0x359,
                          "void Fx_ManCubeDoubleCubeDivisors(Fx_Man_t *, int, Vec_Int_t *, int, int, int *)"
                         );
          }
          iVar2 = p->vCubeFree->nSize + iVar1 + -1;
          iVar1 = 1;
        }
        else {
          if (iVar2 <= i) {
            __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                          ,0x35f,
                          "void Fx_ManCubeDoubleCubeDivisors(Fx_Man_t *, int, Vec_Int_t *, int, int, int *)"
                         );
          }
          iVar2 = 1 - (iVar1 + p->vCubeFree->nSize);
          iVar1 = -1;
        }
        Vec_FltAddToEntry(p_00,i,(float)iVar2);
        p->nPairsD = p->nPairsD + iVar1;
        if (fUpdate != 0) {
          iVar1 = Vec_QueIsMember(p->vPrio,i);
          if (iVar1 == 0) {
            if (fRemove == 0) {
              Vec_QuePush(p->vPrio,i);
            }
          }
          else {
            Vec_QueUpdate(p->vPrio,i);
          }
        }
      }
    }
LAB_00248e53:
    iFirst = iFirst + 1;
  } while( true );
}

Assistant:

void Fx_ManCubeDoubleCubeDivisors( Fx_Man_t * p, int iFirst, Vec_Int_t * vPivot, int fRemove, int fUpdate, int * fWarning )
{
    Vec_Int_t * vCube;
    int i, iDiv, Base;
    Vec_WecForEachLevelStart( p->vCubes, vCube, i, iFirst )
    {
        if ( Vec_IntSize(vCube) == 0 || vCube == vPivot )
            continue;
        if ( Vec_WecIntHasMark(vCube) && Vec_WecIntHasMark(vPivot) && vCube > vPivot )
            continue;
        if ( Vec_IntEntry(vCube, 0) != Vec_IntEntry(vPivot, 0) )
            break;
        Base = Fx_ManDivFindCubeFree( vCube, vPivot, p->vCubeFree, fWarning );
        if ( Vec_IntSize(p->vCubeFree) == 4 )
        { 
            int Value = Fx_ManDivNormalize( p->vCubeFree );
            if ( Value == 0 )
                p->nDivMux[0]++;
            else if ( Value == 1 )
                p->nDivMux[1]++;
            else
                p->nDivMux[2]++;
            if ( p->fCanonDivs && Value < 0 )
                continue;
        }
        if ( p->LitCountMax && p->LitCountMax < Vec_IntSize(p->vCubeFree) )
            continue;
        if ( p->fCanonDivs && Vec_IntSize(p->vCubeFree) == 3 )
            continue;
        iDiv = Hsh_VecManAdd( p->pHash, p->vCubeFree );
        if ( !fRemove )
        {
            if ( iDiv == Vec_FltSize(p->vWeights) )
                Vec_FltPush(p->vWeights, -Vec_IntSize(p->vCubeFree) + 0.9 - 0.0009 * Fx_ManComputeLevelDiv(p, p->vCubeFree));
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, Base + Vec_IntSize(p->vCubeFree) - 1 );
            p->nPairsD++;
        }
        else
        {
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, -(Base + Vec_IntSize(p->vCubeFree) - 1) );
            p->nPairsD--;
        }
        if ( fUpdate )
        {
            if ( Vec_QueIsMember(p->vPrio, iDiv) )
                Vec_QueUpdate( p->vPrio, iDiv );
            else if ( !fRemove )
                Vec_QuePush( p->vPrio, iDiv );
        }
    } 
}